

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  const_iterator rollback;
  region *other;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region retval;
  result<toml::detail::region,_toml::detail::none_t> local_110;
  region local_c0;
  region local_78;
  
  region::region(&local_c0,loc);
  rollback._M_current = (loc->iter_)._M_current;
  either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke(&local_110,loc);
  bVar1 = local_110.is_ok_;
  if (local_110.is_ok_ == false) {
    location::reset(loc,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    rollback._M_current =
         (char *)result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_110);
    region::operator+=(&local_c0,(region *)rollback._M_current);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup
            (&local_110,(EVP_PKEY_CTX *)rollback._M_current);
  if (bVar1 != false) {
    do {
      either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>::invoke(&local_110,loc);
      bVar1 = local_110.is_ok_;
      if (local_110.is_ok_ == false) {
        region::region(&local_78,&local_c0);
        other = &local_78;
        result<toml::detail::region,_toml::detail::none_t>::result
                  (__return_storage_ptr__,(success_type *)&local_78);
        region::~region(&local_78);
      }
      else {
        other = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_110);
        region::operator+=(&local_c0,other);
      }
      result<toml::detail::region,_toml::detail::none_t>::cleanup(&local_110,(EVP_PKEY_CTX *)other);
    } while (bVar1 != false);
  }
  region::~region(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);

        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }